

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O3

GLuint add_shader_file(GLuint p_id,string *p_filepath,string *p_content,ShaderType *p_type)

{
  GLuint local_9c;
  ShaderFile local_98;
  pair<unsigned_int,_ShaderFile> local_50;
  
  local_9c = p_id;
  ShaderFile::ShaderFile(&local_98,p_filepath,p_content,*p_type);
  std::pair<unsigned_int,_ShaderFile>::pair<ShaderFile,_true>(&local_50,&local_9c,&local_98);
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,ShaderFile>,std::allocator<std::pair<unsigned_int_const,ShaderFile>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_int,ShaderFile>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,ShaderFile>,std::allocator<std::pair<unsigned_int_const,ShaderFile>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)ShaderDb::file_map,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.second.m_content._M_dataplus._M_p != &local_50.second.m_content.field_2) {
    operator_delete(local_50.second.m_content._M_dataplus._M_p,
                    local_50.second.m_content.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.second.m_filepath._M_dataplus._M_p != &local_50.second.m_filepath.field_2) {
    operator_delete(local_50.second.m_filepath._M_dataplus._M_p,
                    local_50.second.m_filepath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_content._M_dataplus._M_p != &local_98.m_content.field_2) {
    operator_delete(local_98.m_content._M_dataplus._M_p,
                    local_98.m_content.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_filepath._M_dataplus._M_p != &local_98.m_filepath.field_2) {
    operator_delete(local_98.m_filepath._M_dataplus._M_p,
                    local_98.m_filepath.field_2._M_allocated_capacity + 1);
  }
  return local_9c;
}

Assistant:

GLuint add_shader_file(
    const GLuint p_id,
    const std::string &p_filepath,
    const std::string &p_content,
    const ShaderType &p_type) noexcept
{
    ShaderDb::file_map.emplace(
        std::make_pair(
            p_id,
            ShaderFile(p_filepath,
                       p_content,
                       p_type)));

    return p_id;
}